

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O0

void __thiscall
cmGlobalGenerator::AddRuleHash
          (cmGlobalGenerator *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *outputs,string *content)

{
  bool bVar1;
  int length_00;
  uchar *data_00;
  cmsysMD5 *md5;
  vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *this_00;
  const_reference ppcVar2;
  cmOutputConverter *this_01;
  const_reference source;
  mapped_type *pmVar3;
  undefined1 local_80 [8];
  string fname;
  cmLocalGenerator *lg;
  cmsysMD5 *sum;
  int length;
  uchar *data;
  RuleHash hash;
  string *content_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *outputs_local;
  cmGlobalGenerator *this_local;
  
  hash.Data._24_8_ = content;
  bVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(outputs);
  if (!bVar1) {
    data_00 = (uchar *)std::__cxx11::string::c_str();
    length_00 = std::__cxx11::string::length();
    md5 = cmsysMD5_New();
    cmsysMD5_Initialize(md5);
    cmsysMD5_Append(md5,data_00,length_00);
    cmsysMD5_FinalizeHex(md5,(char *)&data);
    cmsysMD5_Delete(md5);
    this_00 = GetLocalGenerators(this);
    ppcVar2 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::operator[]
                        (this_00,0);
    fname.field_2._8_8_ = *ppcVar2;
    this_01 = &((value_type)fname.field_2._8_8_)->super_cmOutputConverter;
    source = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](outputs,0);
    cmOutputConverter::Convert((string *)local_80,this_01,source,HOME_OUTPUT,UNCHANGED);
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalGenerator::RuleHash,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalGenerator::RuleHash>_>_>
             ::operator[](&this->RuleHashes,(string *)local_80);
    *(uchar **)pmVar3->Data = data;
    *(undefined8 *)(pmVar3->Data + 8) = hash.Data._0_8_;
    *(undefined8 *)(pmVar3->Data + 0x10) = hash.Data._8_8_;
    *(undefined8 *)(pmVar3->Data + 0x18) = hash.Data._16_8_;
    std::__cxx11::string::~string((string *)local_80);
  }
  return;
}

Assistant:

void
cmGlobalGenerator::AddRuleHash(const std::vector<std::string>& outputs,
                               std::string const& content)
{
#if defined(CMAKE_BUILD_WITH_CMAKE)
  // Ignore if there are no outputs.
  if(outputs.empty())
    {
    return;
    }

  // Compute a hash of the rule.
  RuleHash hash;
  {
  unsigned char const* data =
    reinterpret_cast<unsigned char const*>(content.c_str());
  int length = static_cast<int>(content.length());
  cmsysMD5* sum = cmsysMD5_New();
  cmsysMD5_Initialize(sum);
  cmsysMD5_Append(sum, data, length);
  cmsysMD5_FinalizeHex(sum, hash.Data);
  cmsysMD5_Delete(sum);
  }

  // Shorten the output name (in expected use case).
  cmLocalGenerator* lg = this->GetLocalGenerators()[0];
  std::string fname = lg->Convert(outputs[0],
                                  cmLocalGenerator::HOME_OUTPUT);

  // Associate the hash with this output.
  this->RuleHashes[fname] = hash;
#else
  (void)outputs;
  (void)content;
#endif
}